

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_fragment.cpp
# Opt level: O2

void pstore::exchange::export_ns::emit_fragments
               (ostream *os,indent ind,database *db,uint generation,string_mapping *strings,
               bool comments)

{
  bool bVar1;
  uint uVar2;
  typed_address<pstore::trailer> tVar3;
  bool comments_local;
  indent ind_local;
  char *fragment_sep;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragments;
  database *local_78;
  element_type *local_70;
  long local_68;
  anon_class_56_7_97667f36 out_fn;
  
  comments_local = comments;
  ind_local = ind;
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
            ((index *)&fragments,db,true);
  bVar1 = pstore::index::
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::empty(fragments.
                  super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr);
  if (!bVar1) {
    fragment_sep = "\n";
    if (generation == 0) {
      assert_failed("generation > 0U",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_fragment.cpp"
                    ,0x39);
    }
    out_fn.fragment_sep = &fragment_sep;
    out_fn.ind = &ind_local;
    out_fn.comments = &comments_local;
    out_fn.fragments = &fragments;
    out_fn.db = db;
    out_fn.os = os;
    out_fn.strings = strings;
    uVar2 = database::get_current_revision(db);
    if (generation - 1 <= uVar2) {
      tVar3 = database::older_revision_footer_pos(db,generation - 1);
      local_68 = (long)tVar3.a_.a_ + 0x70;
      local_70 = fragments.
                 super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      local_78 = db;
      if (((fragments.
            super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->root_).internal_ != (internal_node *)0x0) {
        diff_details::
        traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
        ::
        visit_node<pstore::exchange::export_ns::diff_out<pstore::exchange::export_ns::emit_fragments(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int,pstore::exchange::export_ns::string_mapping_const&,bool)::__0>>
                  ((traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                    *)&local_78,
                   (fragments.
                    super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->root_,0,&out_fn);
      }
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fragments.
              super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void emit_fragments (ostream & os, indent const ind, database const & db,
                                 unsigned const generation, string_mapping const & strings,
                                 bool const comments) {
                auto const fragments = index::get_index<trailer::indices::fragment> (db);
                if (!fragments->empty ()) {
                    auto const * fragment_sep = "\n";
                    PSTORE_ASSERT (generation > 0U);

                    auto const out_fn = [&] (address const addr) {
                        auto const & kvp = fragments->load_leaf_node (db, addr);
                        os << fragment_sep << ind;
                        emit_digest (os, kvp.first);
                        os << ':';
                        emit_fragment (os, ind, db, strings, db.getro (kvp.second), comments);
                        fragment_sep = ",\n";
                    };

                    diff (db, *fragments, generation - 1U, make_diff_out (&out_fn));
                }
            }